

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlCatalogPrefer xmlCatalogSetDefaultPrefer(xmlCatalogPrefer prefer)

{
  xmlCatalogPrefer xVar1;
  xmlCatalogPrefer xVar2;
  char *fmt;
  
  xVar1 = xmlCatalogDefaultPrefer;
  xVar2 = xmlCatalogDefaultPrefer;
  if ((prefer != XML_CATA_PREFER_NONE) && (xVar2 = prefer, xmlDebugCatalogs != 0)) {
    if (prefer == XML_CATA_PREFER_PUBLIC) {
      fmt = "Setting catalog preference to PUBLIC\n";
    }
    else {
      if (prefer != XML_CATA_PREFER_SYSTEM) {
        return xmlCatalogDefaultPrefer;
      }
      fmt = "Setting catalog preference to SYSTEM\n";
    }
    xmlCatalogPrintDebug(fmt);
    xVar2 = prefer;
  }
  xmlCatalogDefaultPrefer = xVar2;
  return xVar1;
}

Assistant:

xmlCatalogPrefer
xmlCatalogSetDefaultPrefer(xmlCatalogPrefer prefer) {
    xmlCatalogPrefer ret = xmlCatalogDefaultPrefer;

    if (prefer == XML_CATA_PREFER_NONE)
	return(ret);

    if (xmlDebugCatalogs) {
	switch (prefer) {
	    case XML_CATA_PREFER_PUBLIC:
		xmlCatalogPrintDebug(
			"Setting catalog preference to PUBLIC\n");
		break;
	    case XML_CATA_PREFER_SYSTEM:
		xmlCatalogPrintDebug(
			"Setting catalog preference to SYSTEM\n");
		break;
	    default:
		return(ret);
	}
    }
    xmlCatalogDefaultPrefer = prefer;
    return(ret);
}